

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_Downloader.h
# Opt level: O0

void __thiscall Ui_Downloader::retranslateUi(Ui_Downloader *this,QWidget *Downloader)

{
  QLabel *pQVar1;
  QPushButton *pQVar2;
  QString local_b8;
  QString local_a0;
  QString local_88;
  QString local_70;
  QString local_58;
  QString local_30;
  QWidget *local_18;
  QWidget *Downloader_local;
  Ui_Downloader *this_local;
  
  local_18 = Downloader;
  Downloader_local = (QWidget *)this;
  QCoreApplication::translate((char *)&local_30,"Downloader","Updater",0);
  QWidget::setWindowTitle((QString *)Downloader);
  QString::~QString(&local_30);
  pQVar1 = this->updater_icon;
  QString::QString(&local_58);
  QLabel::setText((QString *)pQVar1);
  QString::~QString(&local_58);
  pQVar1 = this->downloadLabel;
  QCoreApplication::translate((char *)&local_70,"Downloader","Downloading updates",0);
  QLabel::setText((QString *)pQVar1);
  QString::~QString(&local_70);
  pQVar1 = this->timeLabel;
  QCoreApplication::translate((char *)&local_88,"Downloader","Time remaining: 0 minutes",0);
  QLabel::setText((QString *)pQVar1);
  QString::~QString(&local_88);
  pQVar2 = this->openButton;
  QCoreApplication::translate((char *)&local_a0,"Downloader","Open",0);
  QAbstractButton::setText((QString *)pQVar2);
  QString::~QString(&local_a0);
  pQVar2 = this->stopButton;
  QCoreApplication::translate((char *)&local_b8,"Downloader","Stop",0);
  QAbstractButton::setText((QString *)pQVar2);
  QString::~QString(&local_b8);
  return;
}

Assistant:

void retranslateUi(QWidget *Downloader)
    {
        Downloader->setWindowTitle(QCoreApplication::translate("Downloader", "Updater", nullptr));
        updater_icon->setText(QString());
        downloadLabel->setText(QCoreApplication::translate("Downloader", "Downloading updates", nullptr));
        timeLabel->setText(QCoreApplication::translate("Downloader", "Time remaining: 0 minutes", nullptr));
        openButton->setText(QCoreApplication::translate("Downloader", "Open", nullptr));
        stopButton->setText(QCoreApplication::translate("Downloader", "Stop", nullptr));
    }